

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

int ClampBits(int width,int height,int bits,int min_bits,int max_bits,int image_size_max)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  uVar2 = 9;
  if ((uint)bits < 9) {
    uVar2 = bits;
  }
  if (bits < 2) {
    uVar2 = 2;
  }
  iVar3 = 1 << ((byte)uVar2 & 0x1f);
  uVar4 = (iVar3 + width) - 1U >> ((byte)uVar2 & 0x1f);
  while( true ) {
    iVar3 = ((uint)(iVar3 + height + -1) >> ((byte)uVar2 & 0x1f)) * uVar4;
    if ((8 < uVar2) || (iVar3 <= min_bits)) break;
    iVar3 = 2 << ((byte)uVar2 & 0x1f);
    uVar2 = uVar2 + 1;
    uVar4 = (uint)(iVar3 + width + -1) >> ((byte)uVar2 & 0x1f);
  }
  bVar5 = iVar3 == 1;
  while( true ) {
    uVar4 = uVar2;
    if ((int)uVar4 < 3) {
      return uVar4;
    }
    if (!bVar5) break;
    bVar1 = (byte)(uVar4 - 1);
    iVar3 = 1 << (bVar1 & 0x1f);
    bVar5 = true;
    uVar2 = uVar4 - 1;
    if (((uint)(iVar3 + height + -1) >> (bVar1 & 0x1f)) *
        ((uint)(iVar3 + width + -1) >> (bVar1 & 0x1f)) != 1) {
      return uVar4;
    }
  }
  return uVar4;
}

Assistant:

static int ClampBits(int width, int height, int bits, int min_bits,
                     int max_bits, int image_size_max) {
  int image_size;
  bits = (bits < min_bits) ? min_bits : (bits > max_bits) ? max_bits : bits;
  image_size = VP8LSubSampleSize(width, bits) * VP8LSubSampleSize(height, bits);
  while (bits < max_bits && image_size > image_size_max) {
    ++bits;
    image_size =
        VP8LSubSampleSize(width, bits) * VP8LSubSampleSize(height, bits);
  }
  // In case the bits reduce the image too much, choose the smallest value
  // setting the histogram image size to 1.
  while (bits > min_bits && image_size == 1) {
    image_size = VP8LSubSampleSize(width, bits - 1) *
                 VP8LSubSampleSize(height, bits - 1);
    if (image_size != 1) break;
    --bits;
  }
  return bits;
}